

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Class_AST_Node::eval_internal(Class_AST_Node *this,Dispatch_State *t_ss)

{
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  Scope_Push_Pop spp;
  allocator local_61;
  Scope_Push_Pop local_60;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string local_38;
  
  detail::Scope_Push_Pop::Scope_Push_Pop(&local_60,in_RDX);
  std::__cxx11::string::string((string *)&local_38,"_current_class_name",&local_61);
  chaiscript::detail::const_var_impl<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  chaiscript::detail::Dispatch_State::add_object(in_RDX,&local_38,(Boxed_Value *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_38);
  AST_Node::eval((AST_Node *)(local_58 + 0x10),
                 *(Dispatch_State **)
                  ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                          _M_mutex + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  Boxed_Value::Object_Data::get();
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_60);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          /// \todo do this better
          // put class name in current scope so it can be looked up by the attrs and methods
          t_ss.add_object("_current_class_name", const_var(children[0]->text));

          children[1]->eval(t_ss);

          return Boxed_Value();
        }